

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress.c
# Opt level: O0

puint32 p_socket_address_get_scope_id(PSocketAddress *addr)

{
  bool bVar1;
  PSocketAddress *addr_local;
  
  bVar1 = true;
  if (addr != (PSocketAddress *)0x0) {
    bVar1 = addr->family != P_SOCKET_FAMILY_INET6;
  }
  if (bVar1) {
    addr_local._4_4_ = 0;
  }
  else {
    addr_local._4_4_ = addr->scope_id;
  }
  return addr_local._4_4_;
}

Assistant:

P_LIB_API puint32
p_socket_address_get_scope_id (const PSocketAddress *addr)
{
#if !defined (AF_INET6) || !defined (PLIBSYS_SOCKADDR_IN6_HAS_SCOPEID)
	P_UNUSED (addr);
	return 0;
#else
	if (P_UNLIKELY (addr == NULL || addr->family != P_SOCKET_FAMILY_INET6))
		return 0;

	return addr->scope_id;
#endif
}